

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_4,_2> * tcu::operator/(Matrix<float,_4,_2> *a,Matrix<float,_4,_2> *b)

{
  Vector<float,_4> *pVVar1;
  Matrix<float,_4,_2> *res;
  Matrix<float,_4,_2> *in_RDI;
  undefined1 auVar2 [16];
  
  auVar2._0_12_ = ZEXT812(0x3f800000);
  auVar2._12_4_ = 0;
  *(undefined1 (*) [16])(in_RDI->m_data).m_data[0].m_data = auVar2;
  (in_RDI->m_data).m_data[1].m_data[0] = 0.0;
  (in_RDI->m_data).m_data[1].m_data[1] = 1.0;
  pVVar1 = (in_RDI->m_data).m_data;
  pVVar1[1].m_data[2] = 0.0;
  pVVar1[1].m_data[3] = 0.0;
  auVar2 = divps(*(undefined1 (*) [16])(a->m_data).m_data[0].m_data,
                 *(undefined1 (*) [16])(b->m_data).m_data[0].m_data);
  *(undefined1 (*) [16])(in_RDI->m_data).m_data[0].m_data = auVar2;
  auVar2 = divps(*(undefined1 (*) [16])(a->m_data).m_data[1].m_data,
                 *(undefined1 (*) [16])(b->m_data).m_data[1].m_data);
  *(undefined1 (*) [16])(in_RDI->m_data).m_data[1].m_data = auVar2;
  return in_RDI;
}

Assistant:

Matrix<T, Rows, Cols> operator/ (const Matrix<T, Rows, Cols>& a, const Matrix<T, Rows, Cols>& b)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = a(row, col) / b(row, col);
	return res;
}